

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_w,float default_h)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiWindow *window;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  
  fVar5 = size.x;
  fVar3 = size.y;
  pIVar1 = GImGui->CurrentWindow;
  if (((fVar5 < 0.0) || (IVar4.x = 0.0, IVar4.y = 0.0, fVar3 < 0.0)) &&
     (IVar4 = (pIVar1->ContentRegionRect).Max, (pIVar1->DC).CurrentColumns != (ImGuiColumns *)0x0))
  {
    IVar4.x = (pIVar1->WorkRect).Max.x;
  }
  if (((fVar5 != 0.0) || (NAN(fVar5))) && (default_w = fVar5, fVar5 < 0.0)) {
    fVar5 = (IVar4.x - (pIVar1->DC).CursorPos.x) + fVar5;
    default_w = 4.0;
    if (4.0 <= fVar5) {
      default_w = fVar5;
    }
  }
  if (((fVar3 != 0.0) || (NAN(fVar3))) && (default_h = fVar3, fVar3 < 0.0)) {
    fVar3 = fVar3 + (IVar4.y - (pIVar1->DC).CursorPos.y);
    default_h = 4.0;
    if (4.0 <= fVar3) {
      default_h = fVar3;
    }
  }
  IVar2.y = default_h;
  IVar2.x = default_w;
  return IVar2;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_w, float default_h)
{
    ImGuiWindow* window = GImGui->CurrentWindow;

    ImVec2 region_max;
    if (size.x < 0.0f || size.y < 0.0f)
        region_max = GetContentRegionMaxAbs();

    if (size.x == 0.0f)
        size.x = default_w;
    else if (size.x < 0.0f)
        size.x = ImMax(4.0f, region_max.x - window->DC.CursorPos.x + size.x);

    if (size.y == 0.0f)
        size.y = default_h;
    else if (size.y < 0.0f)
        size.y = ImMax(4.0f, region_max.y - window->DC.CursorPos.y + size.y);

    return size;
}